

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  ulong uVar1;
  Id *pIVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 local_88 [8];
  Unreachable unreachable;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  undefined1 local_48 [8];
  Drop drop;
  
  if (type.id != 1) {
    visitExpression(this,curr);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"(block",6);
  if (this->minify == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->o," ;; (replaces something unreachable we can\'t emit)",0x32);
  }
  incIndent(this);
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
            ((AbstractChildIterator<wasm::ChildIterator> *)local_88,curr);
  uVar1 = ((ulong)((long)local_58 - (long)local_60) >> 3) + CONCAT44(local_88._4_4_,local_88._0_4_);
  if ((int)uVar1 != 0) {
    uVar5 = 0;
    do {
      uVar4 = ((long)local_58 - (long)local_60 >> 3) + CONCAT44(local_88._4_4_,local_88._0_4_);
      if (uVar4 <= uVar5) {
        __assert_fail("index < children.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/iteration.h"
                      ,0x4a,
                      "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                     );
      }
      uVar3 = (int)uVar4 + ~(uint)uVar5;
      pIVar2 = (Id *)(local_60 + ((ulong)uVar3 - 4));
      if ((uVar3 & 0xfffffffc) == 0) {
        pIVar2 = &unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression.
                  _id + (ulong)uVar3 * 2;
      }
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           **(uintptr_t **)pIVar2;
      local_48._0_4_ = DropId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._id = InvalidId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._4_4_ = 0;
      printFullLine(this,(Expression *)local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar1 & 0xffffffff));
  }
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  local_88._0_4_ = UnreachableId;
  unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._id = BlockId;
  unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._4_4_ = 0;
  printFullLine(this,(Expression *)local_88);
  decIndent(this);
  return;
}

Assistant:

void maybePrintUnreachableReplacement(Expression* curr, Type type) {
    // See the parallel function
    // PrintExpressionContents::printUnreachableReplacement for background. That
    // one handles the header, and this one the body. For convenience, this one
    // also gets a parameter of the type to check for unreachability, to avoid
    // boilerplate in the callers; if the type is not unreachable, it does the
    // normal behavior.
    //
    // Note that the list of instructions using that function must match those
    // using this one, so we print the header and body properly together.

    if (type != Type::unreachable) {
      visitExpression(curr);
      return;
    }

    // Emit a block with drops of the children.
    o << "(block";
    if (!minify) {
      o << " ;; (replaces something unreachable we can't emit)";
    }
    incIndent();
    for (auto* child : ChildIterator(curr)) {
      Drop drop;
      drop.value = child;
      printFullLine(&drop);
    }
    Unreachable unreachable;
    printFullLine(&unreachable);
    decIndent();
  }